

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaClp.c
# Opt level: O2

void Gia_ObjCollapseDeref(Gia_Man_t *p,DdManager *dd,Vec_Ptr_t *vFuncs,int Id)

{
  int *piVar1;
  DdNode *n;
  
  piVar1 = p->pRefs + Id;
  *piVar1 = *piVar1 + -1;
  if (*piVar1 != 0) {
    return;
  }
  n = (DdNode *)Vec_PtrEntry(vFuncs,Id);
  Cudd_RecursiveDeref(dd,n);
  Vec_PtrWriteEntry(vFuncs,Id,(void *)0x0);
  return;
}

Assistant:

void Gia_ObjCollapseDeref( Gia_Man_t * p, DdManager * dd, Vec_Ptr_t * vFuncs, int Id )
{
    if ( Gia_ObjRefDecId(p, Id) )
        return;
    Cudd_RecursiveDeref( dd, (DdNode *)Vec_PtrEntry(vFuncs, Id) );
    Vec_PtrWriteEntry( vFuncs, Id, NULL );
}